

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void Cmd_testfade(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  FScriptPosition *sc;
  FString *this;
  char *pcVar3;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_4c;
  FString local_48 [3];
  uint32 local_2c;
  DWORD color;
  FString colorstring;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  colorstring.Chars._4_4_ = key;
  FString::FString((FString *)&stack0xffffffffffffffd8);
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    Printf("testfade <color>\n");
  }
  else {
    sc = (FScriptPosition *)FCommandLine::operator[](argv,1);
    V_GetColorStringByName((char *)local_48,sc);
    this = FString::operator=((FString *)&stack0xffffffffffffffd8,local_48);
    bVar1 = FString::IsEmpty(this);
    FString::~FString(local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pcVar3 = FCommandLine::operator[](argv,1);
      local_2c = V_GetColorFromString((DWORD *)0x0,pcVar3,(FScriptPosition *)0x0);
    }
    else {
      pcVar3 = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffd8);
      local_2c = V_GetColorFromString((DWORD *)0x0,pcVar3,(FScriptPosition *)0x0);
    }
    level.fadeto = local_2c;
    PalEntry::PalEntry((PalEntry *)&local_4c.field_0,local_2c);
    FDynamicColormap::ChangeFade(&NormalLight,(PalEntry)local_4c);
  }
  FString::~FString((FString *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

CCMD (testfade)
{
	FString colorstring;
	DWORD color;

	if (argv.argc() < 2)
	{
		Printf ("testfade <color>\n");
	}
	else
	{
		if ( !(colorstring = V_GetColorStringByName (argv[1])).IsEmpty() )
		{
			color = V_GetColorFromString (NULL, colorstring);
		}
		else
		{
			color = V_GetColorFromString (NULL, argv[1]);
		}
		level.fadeto = color;
		NormalLight.ChangeFade (color);
	}
}